

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
DecPOMDPDiscrete::ExtractMADPDiscrete
          (DecPOMDPDiscrete *this,MultiAgentDecisionProcessDiscrete *madp)

{
  size_t nrAgents;
  TransitionModelDiscrete *pTVar1;
  ObservationModelDiscrete *pOVar2;
  ulong uVar3;
  long lVar4;
  StateDistribution *p;
  Index s;
  uint uVar5;
  Index o;
  uint uVar6;
  allocator<char> local_81;
  MADPComponentDiscreteActions *local_80;
  MultiAgentDecisionProcessDiscrete *local_78;
  string local_70;
  string local_50;
  
  nrAgents = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                    super_MultiAgentDecisionProcess + 0x10))();
  MultiAgentDecisionProcess::SetNrAgents(&madp->super_MultiAgentDecisionProcess,nrAgents);
  std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             &(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              _m_name._m_name);
  std::__cxx11::string::_M_assign
            ((string *)&(madp->super_MultiAgentDecisionProcess)._m_name._m_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             &(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              _m_name._m_description);
  std::__cxx11::string::_M_assign
            ((string *)&(madp->super_MultiAgentDecisionProcess)._m_name._m_description);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar1 = (TransitionModelDiscrete *)
           (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                  super_MultiAgentDecisionProcess + 0x160))(this);
  madp->_m_p_tModel = pTVar1;
  pOVar2 = (ObservationModelDiscrete *)
           (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                  super_MultiAgentDecisionProcess + 0x168))(this);
  uVar5 = 0;
  madp->_m_p_oModel = pOVar2;
  while( true ) {
    uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    if (uVar3 == uVar5) break;
    lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x38))(this,uVar5);
    std::__cxx11::string::string((string *)&local_70,(string *)(lVar4 + 8));
    MADPComponentDiscreteStates::AddState(&madp->_m_S,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    uVar5 = uVar5 + 1;
  }
  p = (StateDistribution *)
      (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                             super_MultiAgentDecisionProcess + 0x50))(this);
  MADPComponentDiscreteStates::SetISD(&madp->_m_S,p);
  local_80 = (MADPComponentDiscreteActions *)&madp->_m_O;
  uVar5 = 0;
  local_78 = madp;
  while( true ) {
    uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar3 == uVar5) break;
    uVar6 = 0;
    while( true ) {
      uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 200))(this,uVar5);
      if (uVar3 == uVar6) break;
      lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0xd8))(this,uVar5,uVar6);
      std::__cxx11::string::string((string *)&local_70,(string *)(lVar4 + 8));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_81);
      MADPComponentDiscreteObservations::AddObservation
                ((MADPComponentDiscreteObservations *)local_80,uVar5,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar6 = uVar6 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  MADPComponentDiscreteObservations::ConstructJointObservations
            ((MADPComponentDiscreteObservations *)local_80);
  uVar5 = 0;
  local_80 = &local_78->_m_A;
  while( true ) {
    uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar3 == uVar5) break;
    uVar6 = 0;
    while( true ) {
      uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x68))(this,uVar5);
      if (uVar3 == uVar6) break;
      lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x80))(this,uVar5,uVar6);
      std::__cxx11::string::string((string *)&local_70,(string *)(lVar4 + 8));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_81);
      MADPComponentDiscreteActions::AddAction(local_80,uVar5,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar6 = uVar6 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  MADPComponentDiscreteActions::ConstructJointActions(local_80);
  MultiAgentDecisionProcessDiscrete::Initialize(local_78);
  return;
}

Assistant:

void
DecPOMDPDiscrete::ExtractMADPDiscrete(MultiAgentDecisionProcessDiscrete *madp)
{
    madp->SetNrAgents(GetNrAgents());
    madp->SetName(GetName());
    madp->SetDescription(GetDescription());

    // transition model
    madp->SetTransitionModelPtr(
        const_cast<TransitionModelDiscrete*>(GetTransitionModelDiscretePtr()));

    // observation model
    madp->SetObservationModelPtr(
        const_cast<ObservationModelDiscrete*>(GetObservationModelDiscretePtr()));

    // MADPComponentDiscreteStates
    for(Index s=0;s!=GetNrStates();++s)
        madp->AddState(GetState(s)->GetName());

    madp->SetISD(GetISD());

    // MADPComponentDiscreteObservations
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrObservations(id);++o)
            madp->AddObservation(id,GetObservation(id,o)->GetName());
    madp->ConstructJointObservations();

    // MADPComponentDiscreteActions
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrActions(id);++o)
            madp->AddAction(id,GetAction(id,o)->GetName());
    madp->ConstructJointActions();

    madp->Initialize();
}